

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugDrawItemRect(ImU32 col)

{
  ImGuiContext *pIVar1;
  ImDrawList *this;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  this = GetViewportBgFgDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
  ImDrawList::AddRect(this,&(pIVar1->LastItemData).Rect.Min,&(pIVar1->LastItemData).Rect.Max,col,0.0
                      ,0,1.0);
  return;
}

Assistant:

void ImGui::DebugDrawItemRect(ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    GetForegroundDrawList(window)->AddRect(g.LastItemData.Rect.Min, g.LastItemData.Rect.Max, col);
}